

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O1

int bmp_create_bool(char *filename,uint32_t w,uint32_t h,_Bool *data)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  FILE *__s;
  _Bool *data_00;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  char cVar8;
  ulong __size;
  int iVar9;
  
  __size = (ulong)(w * h * 3 + 0x36);
  data_00 = data;
  __ptr = malloc(__size);
  create_header((char *)(ulong)w,h,(uint32_t)__ptr,data_00);
  iVar9 = h - 1;
  if (-1 < iVar9) {
    iVar2 = 4 - (w & 3);
    if ((w & 3) == 0) {
      iVar2 = 0;
    }
    uVar3 = w * iVar9;
    iVar4 = 0x36;
    do {
      if (w != 0) {
        lVar5 = (long)iVar4;
        lVar6 = 0;
        uVar7 = uVar3;
        do {
          cVar8 = data[uVar7] + -1;
          *(char *)((long)__ptr + lVar6 + lVar5) = cVar8;
          *(char *)((long)__ptr + lVar6 + lVar5 + 1) = cVar8;
          *(char *)((long)__ptr + lVar6 + lVar5 + 2) = cVar8;
          lVar6 = lVar6 + 3;
          uVar7 = uVar7 + 1;
        } while ((ulong)w * 3 != lVar6);
        iVar4 = iVar4 + (int)lVar6;
      }
      iVar4 = iVar4 + iVar2;
      uVar3 = uVar3 - w;
      bVar1 = 0 < iVar9;
      iVar9 = iVar9 + -1;
    } while (bVar1);
  }
  __s = fopen(filename,"w");
  fwrite(__ptr,1,__size,__s);
  fclose(__s);
  free(__ptr);
  return 0;
}

Assistant:

int bmp_create_bool(char* filename, uint32_t w, uint32_t h, bool* data) {

	FILE *f;
	int index = 0;

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;
	uint8_t* filedata = (uint8_t*)malloc(filesize);

	//Create header
	index += create_header(filename, w, h, filedata);

	//Write data
	for (int i = h - 1; i >= 0; i--) {
		for (int j = 0; j < w; j++) {
			if (data[i * w + j] == true) {
				filedata[index + 0] = 0x00;
				filedata[index + 1] = 0x00;
				filedata[index + 2] = 0x00;
			} else {
				filedata[index + 0] = 0xFF;
				filedata[index + 1] = 0xFF;
				filedata[index + 2] = 0xFF;
			}
			index += 3;
		}

		//Padding should ensure each section is word aligned
		//TODO: this is broken
		index += (w % 4 != 0) ? 4 - (w % 4) : 0;
	}

	//Write file
	f = fopen(filename, "w");
	fwrite(filedata, 1, filesize, f);
	fclose(f);

	free(filedata);

	return 0;
}